

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tchostsi.cpp
# Opt level: O3

void __thiscall CTcHostIfcStdio::v_print_step(CTcHostIfcStdio *this,char *msg,__va_list_tag *args)

{
  char *pcVar1;
  CTcHostIfcStdio *this_00;
  
  if (this->show_progress_ != 0) {
    pcVar1 = "\t";
    if (this->status_prefix_ != (char *)0x0) {
      pcVar1 = this->status_prefix_;
    }
    this_00 = (CTcHostIfcStdio *)0x2f24eb;
    printf("%s",pcVar1);
    v_printf(this_00,msg,args);
    return;
  }
  return;
}

Assistant:

void CTcHostIfcStdio::v_print_step(const char *msg, va_list args)
{
    /* if we're showing progress messages, proceed */
    if (show_progress_)
    {
        /* show the status message prefix (use a tab by default) */
        printf("%s", status_prefix_ != 0 ? status_prefix_ : "\t");

        /* display the message on the standard output */
        v_printf(msg, args);
    }
}